

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

char * crn_get_mip_filter_name(crn_mip_filter f)

{
  char *pcStack_10;
  crn_mip_filter f_local;
  
  switch(f) {
  case cCRNMipFilterBox:
    pcStack_10 = "box";
    break;
  case cCRNMipFilterTent:
    pcStack_10 = "tent";
    break;
  case cCRNMipFilterLanczos4:
    pcStack_10 = "lanczos4";
    break;
  case cCRNMipFilterMitchell:
    pcStack_10 = "mitchell";
    break;
  case cCRNMipFilterKaiser:
    pcStack_10 = "kaiser";
    break;
  default:
    pcStack_10 = "?";
  }
  return pcStack_10;
}

Assistant:

const char* crn_get_mip_filter_name(crn_mip_filter f)
{
    switch (f)
    {
    case cCRNMipFilterBox:
        return "box";
    case cCRNMipFilterTent:
        return "tent";
    case cCRNMipFilterLanczos4:
        return "lanczos4";
    case cCRNMipFilterMitchell:
        return "mitchell";
    case cCRNMipFilterKaiser:
        return "kaiser";
    default:
        break;
    }
    return "?";
}